

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

int init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  
  use_hdmp();
  fwrite("heap debugger enabled: use hdmp <executable> <core> to examine post-mortem output\n",0x52,
         1,_stderr);
  iVar1 = fprintf(_stderr,
                  "debug level=%d, stack frames=%d, freelist size=%d, fill memory? %d, keep %d larger than %jd, buffer memory used=%d\n"
                  ,(ulong)(uint)hdbg.level,(ulong)(uint)hdbg.maxframes,(ulong)(uint)hdbg.freelistmax
                  ,(ulong)(uint)hdbg.doFill,(ulong)(uint)hdbg.maxbig,hdbg.rememberbigger,
                  (ulong)(uint)malloc_total);
  return iVar1;
}

Assistant:

__attribute__((constructor)) static void init() {
    use_hdmp(); // just in case it hasn't been called yet
    fprintf(stderr, "heap debugger enabled: "
            "use hdmp <executable> <core> to examine post-mortem output\n");
    fprintf(stderr, "debug level=%d, stack frames=%d, freelist size=%d, "
                    "fill memory? %d, keep %d larger than %jd, "
                    "buffer memory used=%d\n",
        hdbg.level,
        (int)hdbg.maxframes,
        hdbg.freelistmax,
        hdbg.doFill,
        (int)hdbg.maxbig,
        (intmax_t)hdbg.rememberbigger,
        malloc_total);
}